

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O0

void __thiscall
HighsHashTable<int,_std::pair<double,_int>_>::growTable
          (HighsHashTable<int,_std::pair<double,_int>_> *this)

{
  HighsHashTable<int,_std::pair<double,_int>_> *this_00;
  type puVar1;
  HighsHashTable<int,_std::pair<double,_int>_> *in_RDI;
  u64 i;
  HighsHashTableEntry<int,_std::pair<double,_int>_> *in_stack_00000020;
  u64 oldCapactiy;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> oldMetadata;
  unique_ptr<HighsHashTableEntry<int,_std::pair<double,_int>_>,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
  oldEntries;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  HighsHashTable<int,_std::pair<double,_int>_> *local_38;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *in_stack_ffffffffffffffd0;
  u64 in_stack_ffffffffffffffd8;
  
  std::
  unique_ptr<HighsHashTableEntry<int,_std::pair<double,_int>_>,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
  ::unique_ptr(&in_RDI->entries,
               (unique_ptr<HighsHashTableEntry<int,_std::pair<double,_int>_>,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
                *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)in_RDI,
             (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  this_00 = (HighsHashTable<int,_std::pair<double,_int>_> *)(in_RDI->tableSizeMask + 1);
  makeEmptyTable(this_00,in_stack_ffffffffffffffd8);
  for (local_38 = (HighsHashTable<int,_std::pair<double,_int>_> *)0x0; local_38 != this_00;
      local_38 = (HighsHashTable<int,_std::pair<double,_int>_> *)
                 ((long)&(local_38->entries)._M_t.
                         super___uniq_ptr_impl<HighsHashTableEntry<int,_std::pair<double,_int>_>,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
                         .
                         super__Head_base<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_false>
                         ._M_head_impl + 1)) {
    puVar1 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                       ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)in_RDI
                        ,CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    in_stack_ffffffffffffffbf = occupied(in_RDI,*puVar1);
    if ((bool)in_stack_ffffffffffffffbf) {
      std::
      unique_ptr<HighsHashTableEntry<int,_std::pair<double,_int>_>,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
      ::get(&in_RDI->entries);
      HighsHashTable<int,std::pair<double,int>>::
      insert<HighsHashTableEntry<int,std::pair<double,int>>>
                ((HighsHashTable<int,_std::pair<double,_int>_> *)oldCapactiy,in_stack_00000020);
    }
  }
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            (in_stack_ffffffffffffffd0);
  std::
  unique_ptr<HighsHashTableEntry<int,_std::pair<double,_int>_>,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
  ::~unique_ptr(&in_RDI->entries);
  return;
}

Assistant:

void growTable() {
    decltype(entries) oldEntries = std::move(entries);
    decltype(metadata) oldMetadata = std::move(metadata);
    u64 oldCapactiy = tableSizeMask + 1;

    makeEmptyTable(2 * oldCapactiy);

    for (u64 i = 0; i != oldCapactiy; ++i)
      if (occupied(oldMetadata[i])) insert(std::move(oldEntries.get()[i]));
  }